

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_chr.c
# Opt level: O0

uint byte_chr(char *s,uint n,int c)

{
  char cVar1;
  char *pcVar2;
  char *local_28;
  char *t;
  uint uStack_14;
  char ch;
  int c_local;
  uint n_local;
  char *s_local;
  
  cVar1 = (char)c;
  uStack_14 = n;
  for (local_28 = s;
      ((((pcVar2 = local_28, uStack_14 != 0 && (*local_28 != cVar1)) &&
        (pcVar2 = local_28 + 1, uStack_14 != 1)) &&
       ((*pcVar2 != cVar1 && (pcVar2 = local_28 + 2, uStack_14 != 2)))) &&
      ((*pcVar2 != cVar1 && ((pcVar2 = local_28 + 3, uStack_14 != 3 && (*pcVar2 != cVar1))))));
      local_28 = local_28 + 4) {
    uStack_14 = uStack_14 - 4;
  }
  local_28 = pcVar2;
  return (int)local_28 - (int)s;
}

Assistant:

unsigned int byte_chr(s,n,c)
char *s;
register unsigned int n;
int c;
{
  register char ch;
  register char *t;

  ch = c;
  t = s;
  for (;;) {
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
    if (!n) break; if (*t == ch) break; ++t; --n;
  }
  return t - s;
}